

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkleblock.cpp
# Opt level: O2

uint256 * __thiscall
CPartialMerkleTree::ExtractMatches
          (uint256 *__return_storage_ptr__,CPartialMerkleTree *this,
          vector<uint256,_std::allocator<uint256>_> *vMatch,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *vnIndex)

{
  uint uVar1;
  long lVar2;
  pointer puVar3;
  base_blob<256U> *pbVar4;
  int height;
  ulong uVar5;
  long in_FS_OFFSET;
  uint nHashUsed;
  uint nBitsUsed;
  uint256 hashMerkleRoot;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  puVar3 = (vMatch->super__Vector_base<uint256,_std::allocator<uint256>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((vMatch->super__Vector_base<uint256,_std::allocator<uint256>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar3) {
    (vMatch->super__Vector_base<uint256,_std::allocator<uint256>_>)._M_impl.super__Vector_impl_data.
    _M_finish = puVar3;
  }
  uVar1 = this->nTransactions;
  if (((((ulong)uVar1 == 0) || (0x411a < uVar1)) ||
      (uVar5 = (long)(this->vHash).super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this->vHash).super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                     super__Vector_impl_data._M_start >> 5, uVar1 < uVar5)) ||
     ((ulong)(this->vBits).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
      ((long)(this->vBits).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
      (long)(this->vBits).super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8 < uVar5)) {
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
LAB_002ddf5a:
      __stack_chk_fail();
    }
    pbVar4 = &__return_storage_ptr__->super_base_blob<256U>;
    (pbVar4->m_data)._M_elems[0x10] = '\0';
    (pbVar4->m_data)._M_elems[0x11] = '\0';
    (pbVar4->m_data)._M_elems[0x12] = '\0';
    (pbVar4->m_data)._M_elems[0x13] = '\0';
    (pbVar4->m_data)._M_elems[0x14] = '\0';
    (pbVar4->m_data)._M_elems[0x15] = '\0';
    (pbVar4->m_data)._M_elems[0x16] = '\0';
    (pbVar4->m_data)._M_elems[0x17] = '\0';
    pbVar4 = &__return_storage_ptr__->super_base_blob<256U>;
    (pbVar4->m_data)._M_elems[0x18] = '\0';
    (pbVar4->m_data)._M_elems[0x19] = '\0';
    (pbVar4->m_data)._M_elems[0x1a] = '\0';
    (pbVar4->m_data)._M_elems[0x1b] = '\0';
    (pbVar4->m_data)._M_elems[0x1c] = '\0';
    (pbVar4->m_data)._M_elems[0x1d] = '\0';
    (pbVar4->m_data)._M_elems[0x1e] = '\0';
    (pbVar4->m_data)._M_elems[0x1f] = '\0';
    (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[0] = '\0';
    (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[1] = '\0';
    (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[2] = '\0';
    (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[3] = '\0';
    (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[4] = '\0';
    (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[5] = '\0';
    (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[6] = '\0';
    (__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems[7] = '\0';
    pbVar4 = &__return_storage_ptr__->super_base_blob<256U>;
    (pbVar4->m_data)._M_elems[8] = '\0';
    (pbVar4->m_data)._M_elems[9] = '\0';
    (pbVar4->m_data)._M_elems[10] = '\0';
    (pbVar4->m_data)._M_elems[0xb] = '\0';
    (pbVar4->m_data)._M_elems[0xc] = '\0';
    (pbVar4->m_data)._M_elems[0xd] = '\0';
    (pbVar4->m_data)._M_elems[0xe] = '\0';
    (pbVar4->m_data)._M_elems[0xf] = '\0';
  }
  else {
    height = -1;
    do {
      height = height + 1;
    } while (1 < ~(-1 << ((byte)height & 0x1f)) + uVar1 >> ((byte)height & 0x1f));
    nBitsUsed = 0;
    nHashUsed = 0;
    TraverseAndExtract(&hashMerkleRoot,this,height,0,&nBitsUsed,&nHashUsed,vMatch,vnIndex);
    if (((this->fBad == true) ||
        (((long)(this->vBits).super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p +
          (((ulong)(this->vBits).super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset + 7 >> 3) -
          (long)(this->vBits).super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) &
         0x1fffffffffffffff) != (ulong)(nBitsUsed + 7 >> 3))) ||
       ((long)(this->vHash).super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(this->vHash).super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
              super__Vector_impl_data._M_start >> 5 != (ulong)nHashUsed)) {
      hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0] = '\0';
      hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[1] = '\0';
      hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[2] = '\0';
      hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[3] = '\0';
      hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[4] = '\0';
      hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[5] = '\0';
      hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[6] = '\0';
      hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[7] = '\0';
      hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[8] = '\0';
      hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[9] = '\0';
      hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[10] = '\0';
      hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
      hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
      hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
      hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
      hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
      pbVar4 = &__return_storage_ptr__->super_base_blob<256U>;
      (pbVar4->m_data)._M_elems[0x10] = '\0';
      (pbVar4->m_data)._M_elems[0x11] = '\0';
      (pbVar4->m_data)._M_elems[0x12] = '\0';
      (pbVar4->m_data)._M_elems[0x13] = '\0';
      (pbVar4->m_data)._M_elems[0x14] = '\0';
      (pbVar4->m_data)._M_elems[0x15] = '\0';
      (pbVar4->m_data)._M_elems[0x16] = '\0';
      (pbVar4->m_data)._M_elems[0x17] = '\0';
      pbVar4 = &__return_storage_ptr__->super_base_blob<256U>;
      (pbVar4->m_data)._M_elems[0x18] = '\0';
      (pbVar4->m_data)._M_elems[0x19] = '\0';
      (pbVar4->m_data)._M_elems[0x1a] = '\0';
      (pbVar4->m_data)._M_elems[0x1b] = '\0';
      (pbVar4->m_data)._M_elems[0x1c] = '\0';
      (pbVar4->m_data)._M_elems[0x1d] = '\0';
      (pbVar4->m_data)._M_elems[0x1e] = '\0';
      (pbVar4->m_data)._M_elems[0x1f] = '\0';
    }
    else {
      *(undefined8 *)((__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems + 0x10) =
           hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._16_8_;
      *(undefined8 *)((__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems + 0x18) =
           hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._24_8_;
    }
    *(undefined4 *)(__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems =
         hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._0_4_;
    *(undefined4 *)((__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems + 4) =
         hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._4_4_;
    *(undefined4 *)((__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems + 8) =
         hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._8_4_;
    *(undefined4 *)((__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems + 0xc) =
         hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._12_4_;
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) goto LAB_002ddf5a;
  }
  return __return_storage_ptr__;
}

Assistant:

uint256 CPartialMerkleTree::ExtractMatches(std::vector<uint256> &vMatch, std::vector<unsigned int> &vnIndex) {
    vMatch.clear();
    // An empty set will not work
    if (nTransactions == 0)
        return uint256();
    // check for excessively high numbers of transactions
    if (nTransactions > MAX_BLOCK_WEIGHT / MIN_TRANSACTION_WEIGHT)
        return uint256();
    // there can never be more hashes provided than one for every txid
    if (vHash.size() > nTransactions)
        return uint256();
    // there must be at least one bit per node in the partial tree, and at least one node per hash
    if (vBits.size() < vHash.size())
        return uint256();
    // calculate height of tree
    int nHeight = 0;
    while (CalcTreeWidth(nHeight) > 1)
        nHeight++;
    // traverse the partial tree
    unsigned int nBitsUsed = 0, nHashUsed = 0;
    uint256 hashMerkleRoot = TraverseAndExtract(nHeight, 0, nBitsUsed, nHashUsed, vMatch, vnIndex);
    // verify that no problems occurred during the tree traversal
    if (fBad)
        return uint256();
    // verify that all bits were consumed (except for the padding caused by serializing it as a byte sequence)
    if ((nBitsUsed+7)/8 != (vBits.size()+7)/8)
        return uint256();
    // verify that all hashes were consumed
    if (nHashUsed != vHash.size())
        return uint256();
    return hashMerkleRoot;
}